

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.hpp
# Opt level: O2

void __thiscall
websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>::
log_err<std::error_code>
          (endpoint<websocketpp::config::asio::transport_config> *this,level l,char *msg,
          error_code *ec)

{
  basic<websocketpp::concurrency::basic,_websocketpp::log::elevel> *this_00;
  ostream *poVar1;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  error_code *__n;
  stringstream s;
  string asStack_1c8 [32];
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  __n = ec;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::operator<<(local_198,msg);
  poVar1 = std::operator<<(poVar1," error: ");
  pbVar2 = std::operator<<(poVar1,ec);
  poVar1 = std::operator<<(pbVar2," (");
  (**(code **)(*(long *)ec->_M_cat + 0x20))(asStack_1c8,ec->_M_cat,ec->_M_value);
  poVar1 = std::operator<<(poVar1,asStack_1c8);
  std::operator<<(poVar1,")");
  std::__cxx11::string::~string(asStack_1c8);
  this_00 = (this->m_elog).
            super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  std::__cxx11::stringbuf::str();
  log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>::write
            (this_00,l,asStack_1c8,(size_t)__n);
  std::__cxx11::string::~string(asStack_1c8);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void log_err(log::level l, char const * msg, error_type const & ec) {
        std::stringstream s;
        s << msg << " error: " << ec << " (" << ec.message() << ")";
        m_elog->write(l,s.str());
    }